

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcCoveringType::~IfcCoveringType(IfcCoveringType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)this = 0x84b588;
  *(undefined8 *)&this->field_0x1c0 = 0x84b6a0;
  *(undefined8 *)&this->field_0x88 = 0x84b5b0;
  *(undefined8 *)&this->field_0x98 = 0x84b5d8;
  *(undefined8 *)&this->field_0xf0 = 0x84b600;
  *(undefined8 *)&this->field_0x148 = 0x84b628;
  *(undefined8 *)&this->field_0x180 = 0x84b650;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCoveringType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x84b678;
  puVar1 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCoveringType,_1UL>).field_0x10;
  if (puVar1 != &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCoveringType,_1UL>).
                 field_0x20) {
    operator_delete(puVar1);
  }
  *(undefined8 *)this = 0x84b968;
  *(undefined8 *)&this->field_0x1c0 = 0x84ba30;
  *(undefined8 *)&this->field_0x88 = 0x84b990;
  *(undefined8 *)&this->field_0x98 = 0x84b9b8;
  *(undefined8 *)&this->field_0xf0 = 0x84b9e0;
  *(undefined8 *)&this->field_0x148 = 0x84ba08;
  if (*(undefined1 **)&this->field_0x158 != &this->field_0x168) {
    operator_delete(*(undefined1 **)&this->field_0x158);
  }
  IfcTypeProduct::~IfcTypeProduct((IfcTypeProduct *)this,&PTR_construction_vtable_24__0084b6c8);
  operator_delete(this);
  return;
}

Assistant:

IfcCoveringType() : Object("IfcCoveringType") {}